

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::Tracks::ParseTrackEntry
          (Tracks *this,longlong track_start,longlong track_size,longlong element_start,
          longlong element_size,Track **pResult)

{
  IMkvReader *pReader;
  longlong lVar1;
  ulong uVar2;
  ulong uVar3;
  longlong element_size_00;
  int iVar4;
  long lVar5;
  unsigned_long_long uVar6;
  long lVar7;
  uchar *puVar8;
  Track *pTVar9;
  long lVar10;
  longlong lVar11;
  long stop;
  longlong lVar12;
  long start;
  bool bVar13;
  long lStack_130;
  uchar b;
  longlong id;
  Tracks *local_110;
  long local_108;
  Track **local_100;
  longlong local_f8;
  longlong local_f0;
  longlong local_e8;
  ulong local_e0;
  longlong pos;
  longlong local_d0;
  longlong local_c8;
  ulong local_c0;
  ulong local_b8;
  longlong size;
  Info local_a8;
  
  if (*pResult != (Track *)0x0) {
    return -1;
  }
  pReader = this->m_pSegment->m_pReader;
  stop = track_size + track_start;
  local_a8.codecPrivate = (uchar *)0x0;
  local_a8.codecPrivateSize = 0;
  local_a8.codecId = (char *)0x0;
  local_a8.codecNameAsUTF8 = (char *)0x0;
  local_a8.nameAsUTF8 = (char *)0x0;
  local_a8.language = (char *)0x0;
  local_a8.codecDelay = 0;
  local_a8.seekPreRoll = 0;
  local_a8.uid = 0;
  local_a8.defaultDuration = 0;
  local_a8.type = 0;
  local_a8.number = 0;
  local_a8.lacing = false;
  start = -1;
  local_e0 = 1;
  local_e8 = -1;
  local_b8 = 0xffffffffffffffff;
  local_c8 = -1;
  local_c0 = 0xffffffffffffffff;
  local_d0 = -1;
  local_110 = this;
  local_100 = pResult;
  local_f8 = element_start;
  local_f0 = element_size;
  pos = track_start;
LAB_00117f02:
  uVar3 = local_b8;
  uVar2 = local_c0;
  lVar10 = -2;
  lStack_130 = lVar10;
  if (stop <= pos) {
    if (((pos != stop) || (local_a8.number < 1)) ||
       (pTVar9 = GetTrackByNumber(local_110,local_a8.number),
       local_a8.type < 1 || pTVar9 != (Track *)0x0)) goto LAB_00118340;
    local_a8.lacing = 0 < (long)local_e0;
    if (local_a8.type == 2) {
      if (-1 < (long)uVar2 || (long)uVar3 < 0) goto LAB_00118340;
      local_a8.settings.start = uVar3;
      local_a8.settings.size = local_c8;
      id = 0;
      lStack_130 = AudioTrack::Parse(local_110->m_pSegment,&local_a8,local_f8,local_f0,
                                     (AudioTrack **)&id);
      if (lStack_130 != 0) goto LAB_00118340;
      *local_100 = (Track *)id;
      if (id == 0) {
        __assert_fail("pResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x174a,
                      "long mkvparser::Tracks::ParseTrackEntry(long long, long long, long long, long long, Track *&) const"
                     );
      }
      if (-1 < start) {
        Track::ParseContentEncodingsEntry((Track *)id,start,local_e8);
      }
    }
    else if (local_a8.type == 1) {
      if (-1 < (long)uVar3 || (long)uVar2 < 0) goto LAB_00118340;
      local_a8.settings.start = uVar2;
      local_a8.settings.size = local_d0;
      id = 0;
      lStack_130 = VideoTrack::Parse(local_110->m_pSegment,&local_a8,local_f8,local_f0,
                                     (VideoTrack **)&id);
      if (lStack_130 != 0) goto LAB_00118340;
      *local_100 = (Track *)id;
      if (id == 0) {
        __assert_fail("pResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1734,
                      "long mkvparser::Tracks::ParseTrackEntry(long long, long long, long long, long long, Track *&) const"
                     );
      }
      if (-1 < start) {
        Track::ParseContentEncodingsEntry((Track *)id,start,local_e8);
      }
    }
    else {
      if ((-1 < (long)(uVar3 & uVar2)) || (local_a8.type == 0x21 && -1 < start)) goto LAB_00118340;
      local_a8.settings.start = 0xffffffffffffffff;
      local_a8.settings.size = 0;
      id = 0;
      lStack_130 = Track::Create(local_110->m_pSegment,&local_a8,local_f8,local_f0,(Track **)&id);
      if (lStack_130 != 0) goto LAB_00118340;
      *local_100 = (Track *)id;
      if (id == 0) {
        __assert_fail("pResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1766,
                      "long mkvparser::Tracks::ParseTrackEntry(long long, long long, long long, long long, Track *&) const"
                     );
      }
    }
    lStack_130 = 0;
    goto LAB_00118340;
  }
  lStack_130 = ParseElementHeader(pReader,&pos,stop,&id,&size);
  element_size_00 = size;
  lVar1 = pos;
  if ((lStack_130 < 0) || (lStack_130 = lVar10, size < 0)) goto LAB_00118340;
  if (id == 0x83) {
    lVar7 = UnserializeUInt(pReader,pos,size);
    lVar5 = local_a8.number;
    uVar6 = local_a8.defaultDuration;
    if (0xfd < lVar7 - 1U) goto LAB_00118340;
  }
  else {
    if (id == 0x86) {
      lStack_130 = UnserializeString(pReader,pos,size,&local_a8.codecId);
      goto LAB_0011821b;
    }
    if (id == 0x9c) {
      local_e0 = UnserializeUInt(pReader,pos,size);
      lVar7 = local_a8.type;
      lVar5 = local_a8.number;
      uVar6 = local_a8.defaultDuration;
      if (1 < local_e0) goto LAB_00118340;
    }
    else if (id == 0xd7) {
      lVar5 = UnserializeUInt(pReader,pos,size);
      lVar7 = local_a8.type;
      uVar6 = local_a8.defaultDuration;
      if (0x7e < lVar5 - 1U) goto LAB_00118340;
    }
    else {
      lVar7 = local_a8.type;
      lVar5 = local_a8.number;
      uVar6 = local_a8.defaultDuration;
      if (id == 0xe0) {
        local_c0 = pos;
        local_d0 = size;
      }
      else {
        if (id == 0x258688) {
          lStack_130 = UnserializeString(pReader,pos,size,&local_a8.codecNameAsUTF8);
        }
        else {
          if (id != 0x536e) {
            if (id == 0x56aa) {
              local_a8.codecDelay = UnserializeUInt(pReader,pos,size);
              lVar7 = local_a8.type;
              lVar5 = local_a8.number;
              uVar6 = local_a8.defaultDuration;
            }
            else if (id == 0x56bb) {
              local_a8.seekPreRoll = UnserializeUInt(pReader,pos,size);
              lVar7 = local_a8.type;
              lVar5 = local_a8.number;
              uVar6 = local_a8.defaultDuration;
            }
            else if (id == 0x63a2) {
              local_108 = start;
              if (local_a8.codecPrivate != (uchar *)0x0) {
                operator_delete__(local_a8.codecPrivate);
              }
              local_a8.codecPrivate = (uchar *)0x0;
              local_a8.codecPrivateSize = 0;
              start = local_108;
              lVar7 = local_a8.type;
              lVar5 = local_a8.number;
              uVar6 = local_a8.defaultDuration;
              if (element_size_00 != 0) {
                puVar8 = SafeArrayAlloc<unsigned_char>(1,element_size_00);
                if (puVar8 == (uchar *)0x0) {
                  lStack_130 = -1;
                  goto LAB_00118340;
                }
                iVar4 = (**pReader->_vptr_IMkvReader)(pReader,lVar1,element_size_00,puVar8);
                if (iVar4 != 0) {
                  operator_delete__(puVar8);
                  lStack_130 = (long)iVar4;
                  goto LAB_00118340;
                }
                local_a8.codecPrivateSize = element_size_00;
                start = local_108;
                lVar7 = local_a8.type;
                lVar5 = local_a8.number;
                uVar6 = local_a8.defaultDuration;
                local_a8.codecPrivate = puVar8;
              }
            }
            else if (id == 0x6d80) {
              local_e8 = size;
              start = pos;
            }
            else if (id == 0x73c5) {
              if (8 < (ulong)size) goto LAB_00118340;
              local_a8.uid = 0;
              lVar11 = size;
              lVar12 = pos;
              local_108 = start;
              while (bVar13 = lVar11 != 0, lVar11 = lVar11 + -1, start = local_108,
                    lVar7 = local_a8.type, lVar5 = local_a8.number, uVar6 = local_a8.defaultDuration
                    , bVar13) {
                iVar4 = (**pReader->_vptr_IMkvReader)(pReader,lVar12,1,&b);
                if (iVar4 != 0) {
                  lStack_130 = (long)iVar4;
                  goto LAB_00118340;
                }
                local_a8.uid = (ulong)b | local_a8.uid << 8;
                lVar12 = lVar12 + 1;
              }
            }
            else {
              if (id == 0x22b59c) {
                lStack_130 = UnserializeString(pReader,pos,size,&local_a8.language);
                goto LAB_0011821b;
              }
              if (id != 0x23e383) {
                if (id == 0xe1) {
                  local_b8 = pos;
                  local_c8 = size;
                }
                goto LAB_00118238;
              }
              uVar6 = UnserializeUInt(pReader,pos,size);
              lVar7 = local_a8.type;
              lVar5 = local_a8.number;
              if ((long)uVar6 < 0) goto LAB_00118340;
            }
            goto LAB_00118238;
          }
          lStack_130 = UnserializeString(pReader,pos,size,&local_a8.nameAsUTF8);
        }
LAB_0011821b:
        lVar7 = local_a8.type;
        lVar5 = local_a8.number;
        uVar6 = local_a8.defaultDuration;
        if (lStack_130 != 0) goto LAB_00118340;
      }
    }
  }
LAB_00118238:
  local_a8.defaultDuration = uVar6;
  local_a8.number = lVar5;
  local_a8.type = lVar7;
  lStack_130 = -2;
  pos = lVar1 + element_size_00;
  if (stop < pos) {
LAB_00118340:
    Track::Info::Clear(&local_a8);
    return lStack_130;
  }
  goto LAB_00117f02;
}

Assistant:

long Tracks::ParseTrackEntry(long long track_start, long long track_size,
                             long long element_start, long long element_size,
                             Track*& pResult) const {
  if (pResult)
    return -1;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = track_start;
  const long long track_stop = track_start + track_size;

  Track::Info info;

  info.type = 0;
  info.number = 0;
  info.uid = 0;
  info.defaultDuration = 0;

  Track::Settings v;
  v.start = -1;
  v.size = -1;

  Track::Settings a;
  a.start = -1;
  a.size = -1;

  Track::Settings e;  // content_encodings_settings;
  e.start = -1;
  e.size = -1;

  long long lacing = 1;  // default is true

  while (pos < track_stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, track_stop, id, size);

    if (status < 0)  // error
      return status;

    if (size < 0)
      return E_FILE_FORMAT_INVALID;

    const long long start = pos;

    if (id == libwebm::kMkvVideo) {
      v.start = start;
      v.size = size;
    } else if (id == libwebm::kMkvAudio) {
      a.start = start;
      a.size = size;
    } else if (id == libwebm::kMkvContentEncodings) {
      e.start = start;
      e.size = size;
    } else if (id == libwebm::kMkvTrackUID) {
      if (size > 8)
        return E_FILE_FORMAT_INVALID;

      info.uid = 0;

      long long pos_ = start;
      const long long pos_end = start + size;

      while (pos_ != pos_end) {
        unsigned char b;

        const int status = pReader->Read(pos_, 1, &b);

        if (status)
          return status;

        info.uid <<= 8;
        info.uid |= b;

        ++pos_;
      }
    } else if (id == libwebm::kMkvTrackNumber) {
      const long long num = UnserializeUInt(pReader, pos, size);

      if ((num <= 0) || (num > 127))
        return E_FILE_FORMAT_INVALID;

      info.number = static_cast<long>(num);
    } else if (id == libwebm::kMkvTrackType) {
      const long long type = UnserializeUInt(pReader, pos, size);

      if ((type <= 0) || (type > 254))
        return E_FILE_FORMAT_INVALID;

      info.type = static_cast<long>(type);
    } else if (id == libwebm::kMkvName) {
      const long status =
          UnserializeString(pReader, pos, size, info.nameAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvLanguage) {
      const long status = UnserializeString(pReader, pos, size, info.language);

      if (status)
        return status;
    } else if (id == libwebm::kMkvDefaultDuration) {
      const long long duration = UnserializeUInt(pReader, pos, size);

      if (duration < 0)
        return E_FILE_FORMAT_INVALID;

      info.defaultDuration = static_cast<unsigned long long>(duration);
    } else if (id == libwebm::kMkvCodecID) {
      const long status = UnserializeString(pReader, pos, size, info.codecId);

      if (status)
        return status;
    } else if (id == libwebm::kMkvFlagLacing) {
      lacing = UnserializeUInt(pReader, pos, size);

      if ((lacing < 0) || (lacing > 1))
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvCodecPrivate) {
      delete[] info.codecPrivate;
      info.codecPrivate = NULL;
      info.codecPrivateSize = 0;

      const size_t buflen = static_cast<size_t>(size);

      if (buflen) {
        unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);

        if (buf == NULL)
          return -1;

        const int status = pReader->Read(pos, static_cast<long>(buflen), buf);

        if (status) {
          delete[] buf;
          return status;
        }

        info.codecPrivate = buf;
        info.codecPrivateSize = buflen;
      }
    } else if (id == libwebm::kMkvCodecName) {
      const long status =
          UnserializeString(pReader, pos, size, info.codecNameAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvCodecDelay) {
      info.codecDelay = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvSeekPreRoll) {
      info.seekPreRoll = UnserializeUInt(pReader, pos, size);
    }

    pos += size;  // consume payload
    if (pos > track_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != track_stop)
    return E_FILE_FORMAT_INVALID;

  if (info.number <= 0)  // not specified
    return E_FILE_FORMAT_INVALID;

  if (GetTrackByNumber(info.number))
    return E_FILE_FORMAT_INVALID;

  if (info.type <= 0)  // not specified
    return E_FILE_FORMAT_INVALID;

  info.lacing = (lacing > 0) ? true : false;

  if (info.type == Track::kVideo) {
    if (v.start < 0)
      return E_FILE_FORMAT_INVALID;

    if (a.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings = v;

    VideoTrack* pTrack = NULL;

    const long status = VideoTrack::Parse(m_pSegment, info, element_start,
                                          element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);

    if (e.start >= 0)
      pResult->ParseContentEncodingsEntry(e.start, e.size);
  } else if (info.type == Track::kAudio) {
    if (a.start < 0)
      return E_FILE_FORMAT_INVALID;

    if (v.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings = a;

    AudioTrack* pTrack = NULL;

    const long status = AudioTrack::Parse(m_pSegment, info, element_start,
                                          element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);

    if (e.start >= 0)
      pResult->ParseContentEncodingsEntry(e.start, e.size);
  } else {
    // neither video nor audio - probably metadata or subtitles

    if (a.start >= 0)
      return E_FILE_FORMAT_INVALID;

    if (v.start >= 0)
      return E_FILE_FORMAT_INVALID;

    if (info.type == Track::kMetadata && e.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings.start = -1;
    info.settings.size = 0;

    Track* pTrack = NULL;

    const long status =
        Track::Create(m_pSegment, info, element_start, element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);
  }

  return 0;  // success
}